

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  undefined *puVar3;
  double *pdVar4;
  int in_ESI;
  TPZVec<double> *in_RDI;
  double dVar5;
  int k;
  int j;
  int i;
  int index;
  TPZFNMatrix<20,_double> dphi2;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  TPZFNMatrix<20,_double> phi2;
  TPZFNMatrix<20,_double> phi1;
  TPZFNMatrix<20,_double> phi0;
  int ord2;
  int ord1;
  double in_stack_fffffffffffff760;
  double *in_stack_fffffffffffff768;
  TPZFNMatrix<20,_double> *in_stack_fffffffffffff770;
  int local_798;
  int local_794;
  int local_790;
  undefined1 local_788 [312];
  undefined1 local_650 [312];
  undefined1 local_518 [312];
  undefined1 local_3e0 [328];
  undefined1 local_298 [312];
  undefined1 local_160 [312];
  int local_28;
  int local_24;
  TPZVec<double> *local_8;
  
  if (2 < in_ESI) {
    local_24 = in_ESI + -2;
    local_28 = in_ESI + -1;
    local_8 = in_RDI;
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    TPZFNMatrix<20,_double>::TPZFNMatrix
              (in_stack_fffffffffffff770,(int64_t)in_stack_fffffffffffff768,
               (int64_t)in_stack_fffffffffffff760);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,0);
    (*(code *)puVar3)(*pdVar4 + *pdVar4 + -1.0,local_24,local_160,local_518);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,1);
    (*(code *)puVar3)(*pdVar4 + *pdVar4 + -1.0,local_24,local_298,local_650);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,2);
    (*(code *)puVar3)(*pdVar4,local_28,local_3e0,local_788);
    for (local_790 = 0; local_790 < local_24; local_790 = local_790 + 1) {
      for (local_794 = 0; local_794 < local_24; local_794 = local_794 + 1) {
        for (local_798 = 0; local_798 < local_28; local_798 = local_798 + 1) {
          if ((local_790 + local_794 < local_24) && (local_798 < local_28)) {
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = dVar5 * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = (dVar5 + dVar5) * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = (dVar5 + dVar5) * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            in_stack_fffffffffffff770 = (TPZFNMatrix<20,_double> *)*pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_fffffffffffff770,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            in_stack_fffffffffffff760 = (double)in_stack_fffffffffffff770 * *pdVar4;
            in_stack_fffffffffffff768 =
                 TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff768,(int64_t)in_stack_fffffffffffff760);
            dVar5 = in_stack_fffffffffffff760 * *in_stack_fffffffffffff768;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff770->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff768,
                                (int64_t)in_stack_fffffffffffff760);
            *pdVar4 = dVar5;
          }
        }
      }
    }
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x188c75a);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x188c767);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x188c774);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x188c781);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x188c78e);
    TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x188c79b);
  }
  return;
}

Assistant:

void TPZShapePrism::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		//valor da fun��o e derivada do produto das fun��es ortogonais
		if(order < 3) return;
		int ord1 = order-2;
		int ord2 = order-1;
		
		TPZFNMatrix<20,REAL> phi0(ord1,1),phi1(ord1,1),phi2(ord2,1),
		dphi0(1,ord1),dphi1(1,ord1),dphi2(1,ord2);
		TPZShapeLinear::fOrthogonal(2.*x[0]-1.,ord1,phi0,dphi0);//f e df       0<=x0<=1 -> -1<=2*x0-1<=1
		TPZShapeLinear::fOrthogonal(2.*x[1]-1.,ord1,phi1,dphi1);//g e dg             0<=x1<=1 -> -1<=2*x1-1<=1
		TPZShapeLinear::fOrthogonal(x[2],ord2,phi2,dphi2);//h e dh      -1<=x3<=1
		int index = 0;//x � ponto de integra��o dentro da pir�mide
		for (int i=0;i<ord1;i++) {
			for (int j=0;j<ord1;j++) {
				for (int k=0;k<ord2;k++) {
					if( i+j < ord1 && k < ord2) {
						phi(index,0) =     phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) = 2.*dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =  2.*phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) =     phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}